

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::SoPlexBase<double>::getBoundViolation
          (SoPlexBase<double> *this,double *maxviol,double *sumviol)

{
  SPxLPBase<double> *pSVar1;
  pointer pdVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  double dVar7;
  
  if ((this->_hasSolReal != true) || (bVar4 = true, ((this->_solReal).field_0x98 & 1) == 0)) {
    if (this->_hasSolRational == true) {
      bVar4 = (bool)((this->_solRational).field_0xd0 & 1);
    }
    else {
      bVar4 = false;
    }
  }
  if (bVar4 != false) {
    if ((this->_hasSolReal == false) && (this->_hasSolRational != false)) {
      SolBase<double>::operator=(&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    *maxviol = 0.0;
    *sumviol = 0.0;
    lVar5 = (long)(this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    if (0 < lVar5) {
      do {
        pSVar1 = this->_realLP;
        if (pSVar1->_isScaled == true) {
          (*pSVar1->lp_scaler->_vptr_SPxScaler[0x16])
                    (pSVar1->lp_scaler,pSVar1,(ulong)((int)lVar5 - 1));
          dVar7 = extraout_XMM0_Qa;
        }
        else {
          dVar7 = (pSVar1->super_LPColSetBase<double>).low.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5 + -1];
        }
        pSVar1 = this->_realLP;
        if (pSVar1->_isScaled == true) {
          (*pSVar1->lp_scaler->_vptr_SPxScaler[0x14])
                    (pSVar1->lp_scaler,pSVar1,(ulong)((int)lVar5 - 1));
          dVar6 = extraout_XMM0_Qa_00;
        }
        else {
          dVar6 = (pSVar1->super_LPColSetBase<double>).up.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5 + -1];
        }
        pdVar2 = (this->_solReal)._primal.val.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar7 = dVar7 - pdVar2[lVar5 + 0xffffffffffffffff];
        if ((0.0 < dVar7) && (*sumviol = *sumviol + dVar7, *maxviol <= dVar7 && dVar7 != *maxviol))
        {
          *maxviol = dVar7;
        }
        dVar6 = pdVar2[lVar5 + 0xffffffffffffffff] - dVar6;
        if ((0.0 < dVar6) && (*sumviol = *sumviol + dVar6, *maxviol <= dVar6 && dVar6 != *maxviol))
        {
          *maxviol = dVar6;
        }
        bVar3 = 1 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar3);
    }
  }
  return bVar4;
}

Assistant:

bool SoPlexBase<R>::getBoundViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numCols() - 1; i >= 0; i--)
   {
      R lower = _realLP->lowerUnscaled(i);
      R upper = _realLP->upperUnscaled(i);
      R viol = lower - primal[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = primal[i] - upper;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}